

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsConstructObject(JsValueRef function,JsValueRef *args,ushort cargs,JsValueRef *result)

{
  anon_class_32_4_3063774b fn;
  JsErrorCode JVar1;
  JsValueRef *local_28;
  JsValueRef *result_local;
  JsValueRef *ppvStack_18;
  ushort cargs_local;
  JsValueRef *args_local;
  JsValueRef function_local;
  
  fn.cargs = (ushort *)&stack0xffffffffffffffe8;
  fn.function = (JsValueRef *)((long)&result_local + 6);
  fn.args = &local_28;
  fn.result = &args_local;
  local_28 = result;
  result_local._6_2_ = cargs;
  ppvStack_18 = args;
  args_local = (JsValueRef *)function;
  JVar1 = ContextAPIWrapper<false,JsConstructObject::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsConstructObject(_In_ JsValueRef function, _In_reads_(cargs) JsValueRef *args, _In_ ushort cargs, _Out_ JsValueRef *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTConstructCall, function, cargs, args);

        VALIDATE_INCOMING_FUNCTION(function, scriptContext);
        PARAM_NOT_NULL(result);
        *result = nullptr;

        if (cargs == 0 || args == nullptr)
        {
            return JsErrorInvalidArgument;
        }

        for (int index = 0; index < cargs; index++)
        {
            VALIDATE_INCOMING_REFERENCE(args[index], scriptContext);
        }

        Js::JavascriptFunction *jsFunction = Js::VarTo<Js::JavascriptFunction>(function);
        Js::CallInfo callInfo(Js::CallFlags::CallFlags_New, cargs);
        Js::Arguments jsArgs(callInfo, reinterpret_cast<Js::Var *>(args));

        //
        //TODO: we will want to look at this at some point -- either treat as "top-level" call or maybe constructors are fast so we can just jump back to previous "real" code
        //TTDAssert(!Js::VarIs<Js::ScriptFunction>(jsFunction) || execContext->GetThreadContext()->TTDRootNestingCount != 0, "This will cause user code to execute and we need to add support for that as a top-level call source!!!!");
        //

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            *result = Js::JavascriptFunction::CallAsConstructor(jsFunction, /* overridingNewTarget = */nullptr, jsArgs, scriptContext);
        }
        END_SAFE_REENTRANT_CALL
        Assert(*result == nullptr || !Js::CrossSite::NeedMarshalVar(*result, scriptContext));

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

        return JsNoError;
    });
}